

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_dump.h
# Opt level: O3

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
::phmap_dump<phmap::BinaryOutputArchive>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
           *this,BinaryOutputArchive *ar)

{
  std::ostream::write((char *)ar->os_,0x1462d0);
  std::ostream::write((char *)ar->os_,(long)&this->size_);
  std::ostream::write((char *)ar->os_,(long)&this->capacity_);
  if (this->size_ != 0) {
    std::ostream::write((char *)ar->os_,(long)this->ctrl_);
    std::ostream::write((char *)ar->os_,(long)this->slots_);
    std::ostream::write((char *)ar->os_,(long)&this->settings_);
  }
  return true;
}

Assistant:

bool raw_hash_set<Policy, Hash, Eq, Alloc>::phmap_dump(OutputArchive& ar) const {
    static_assert(type_traits_internal::IsTriviallyCopyable<value_type>::value,
                    "value_type should be trivially copyable");

    ar.saveBinary(&s_version, sizeof(size_t));
    ar.saveBinary(&size_, sizeof(size_t));
    ar.saveBinary(&capacity_, sizeof(size_t));
    if (size_ == 0)
        return true;
    ar.saveBinary(ctrl_,  sizeof(ctrl_t) * (capacity_ + Group::kWidth + 1));
    ar.saveBinary(slots_, sizeof(slot_type) * capacity_);
    ar.saveBinary(&growth_left(), sizeof(size_t));
    return true;
}